

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicAPIBarrierByRegion::Run(BasicAPIBarrierByRegion *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,4);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,8);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,0x20);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,0x400);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,0x1000);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,0x2000);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,0x342c);
  glu::CallLogWrapper::glMemoryBarrierByRegion(this_00,0xffffffff);
  return 0;
}

Assistant:

virtual long Run()
	{
		glMemoryBarrierByRegion(GL_UNIFORM_BARRIER_BIT);
		glMemoryBarrierByRegion(GL_TEXTURE_FETCH_BARRIER_BIT);
		glMemoryBarrierByRegion(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glMemoryBarrierByRegion(GL_FRAMEBUFFER_BARRIER_BIT);
		glMemoryBarrierByRegion(GL_ATOMIC_COUNTER_BARRIER_BIT);
		glMemoryBarrierByRegion(GL_SHADER_STORAGE_BARRIER_BIT);

		glMemoryBarrierByRegion(GL_UNIFORM_BARRIER_BIT | GL_TEXTURE_FETCH_BARRIER_BIT |
								GL_SHADER_IMAGE_ACCESS_BARRIER_BIT | GL_FRAMEBUFFER_BARRIER_BIT |
								GL_ATOMIC_COUNTER_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);

		glMemoryBarrierByRegion(GL_ALL_BARRIER_BITS);
		return NO_ERROR;
	}